

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int EncodeStreamHook(void *input,void *data2)

{
  HuffmanTreeCode *huffman_code;
  uint32_t color;
  int iVar1;
  code *pcVar2;
  WebPConfig *pWVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  int max_bits;
  int iVar10;
  uint8_t *ptr;
  ulong uVar11;
  HuffmanTree *pHVar12;
  VP8LHistogramSet *image_histo;
  VP8LHistogram *tmp_histo;
  HuffmanTreeCode *pHVar13;
  long lVar14;
  HuffmanTreeToken *tokens;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  VP8LEncoderARGBContent VVar18;
  uint64_t nmemb;
  VP8LBitWriter *pVVar19;
  long lVar20;
  byte bVar21;
  uint uVar22;
  uint32_t uVar23;
  WebPPicture *pWVar24;
  int iVar25;
  HuffmanTreeCode *in_R9;
  int height;
  uint32_t *puVar26;
  ulong uVar27;
  VP8LBackwardRefs *refs;
  uint8_t uVar28;
  ulong uVar29;
  uint32_t *puVar30;
  uint uVar31;
  ulong uVar32;
  VP8LEncoder *enc;
  bool bVar33;
  int percent;
  uint local_19f4;
  ulong local_19f0;
  uint32_t *local_19e8;
  VP8LBitWriter *local_19e0;
  int local_19d4;
  HuffmanTree *local_19d0;
  WebPPicture *local_19c8;
  uint32_t *local_19c0;
  uint32_t *local_19b8;
  uint64_t local_19b0;
  uint local_19a4;
  ulong local_19a0;
  uint32_t *local_1998;
  int local_198c;
  ulong local_1988;
  HuffmanTreeCode *local_1980;
  ulong local_1978;
  VP8LEncoder *local_1970;
  VP8LBackwardRefs *local_1968;
  VP8LHashChain *local_1960;
  int local_1954;
  ulong local_1950;
  long local_1948;
  size_t local_1940;
  VP8LBackwardRefs *local_1938;
  int local_1930;
  int local_192c;
  uint local_1928;
  int local_1924;
  int local_1920;
  int cache_bits_best;
  ulong local_1918;
  size_t local_1910;
  ulong local_1908;
  size_t local_1900;
  void *local_18f8;
  long local_18f0;
  ulong local_18e8;
  ulong local_18e0;
  VP8LBackwardRefs *local_18d8;
  long local_18d0;
  long local_18c8;
  uint32_t *local_18c0;
  VP8LBackwardRefs *local_18b8;
  long local_18b0;
  ulong local_18a8;
  ulong local_18a0;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  uint32_t idx_map [256];
  VP8LHashChain hash_chain_histogram;
  uint16_t buffer [2048];
  
  local_18f0 = *input;
  local_19c8 = *(WebPPicture **)((long)input + 8);
  pVVar19 = *(VP8LBitWriter **)((long)input + 0x10);
  enc = *(VP8LEncoder **)((long)input + 0x18);
  uVar22 = *(uint *)((long)input + 0x1a8);
  local_1978 = (ulong)(uint)(int)*(float *)(local_18f0 + 4);
  local_1920 = *(int *)((long)input + 0x1ac);
  local_18c8 = *(long *)((long)input + 0x1b0);
  local_1924 = *(int *)(local_18f0 + 8);
  bVar33 = local_1924 == 0;
  local_192c = local_19c8->width;
  local_19a0 = (ulong)(uint)local_19c8->height;
  local_18f8 = input;
  local_1900 = VP8LBitWriterNumBytes(pVVar19);
  percent = 2;
  bw_init.bits = pVVar19->bits;
  bw_init.used = pVVar19->used;
  bw_init._12_4_ = *(undefined4 *)&pVVar19->field_0xc;
  bw_init.buf = pVVar19->buf;
  bw_init.cur = pVVar19->cur;
  bw_init.end = pVVar19->end;
  bw_init.error = pVVar19->error;
  bw_init._44_4_ = *(undefined4 *)&pVVar19->field_0x2c;
  local_19e0 = pVVar19;
  iVar4 = VP8LBitWriterInit(&bw_best,0);
  pWVar24 = local_19c8;
  if ((iVar4 == 0) ||
     ((1 < (int)uVar22 &&
      (iVar4 = VP8LBitWriterClone(local_19e0,&bw_best), pWVar24 = local_19c8, iVar4 == 0)))) {
LAB_00133931:
    WebPEncodingSetError(pWVar24,VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto LAB_00133936;
  }
  local_18b0 = (long)local_18f8 + 0x20;
  local_1980 = (HuffmanTreeCode *)(ulong)bVar33;
  local_1968 = enc->refs;
  local_18b8 = enc->refs + 1;
  local_18c0 = enc->palette_sorted;
  local_1998 = enc->palette;
  local_1960 = &enc->hash_chain;
  local_198c = (int)local_19a0 + -1;
  local_18a8 = 0;
  if (0 < (int)uVar22) {
    local_18a8 = (ulong)uVar22;
  }
  local_18d8 = enc->refs + 2;
  uVar32 = 0;
  local_1954 = 0;
  local_1908 = 0;
  local_1940 = 0xffffffffffffffff;
  pVVar19 = local_19e0;
  local_1970 = enc;
  local_1928 = uVar22;
LAB_001325fb:
  if (uVar32 == local_18a8) goto LAB_0013396d;
  uVar31 = *(uint *)(local_18b0 + uVar32 * 0x1c);
  VVar18 = kEncoderNone;
  iVar4 = (int)(0x61 / (long)(int)uVar22);
  uVar5 = uVar31 & 0xfffffffe;
  uVar6 = (uint)(uVar31 == 5 || (uVar31 & 0xfffffffd) == 1);
  uVar31 = 0;
  if (local_1920 == 0) {
    uVar31 = uVar6;
  }
  if (uVar5 == 4) {
    uVar31 = 0;
  }
  local_1948 = uVar32 * 0x1c + local_18b0;
  enc->use_palette = (uint)(uVar5 == 4);
  enc->use_subtract_green = (uint)(uVar5 == 2);
  enc->use_predict = uVar6;
  if (local_1924 == 0) {
    uVar31 = 0;
  }
  enc->use_cross_color = uVar31;
  enc->cache_bits = 0;
  lVar14 = local_18b0;
  local_18a0 = uVar32;
  VP8LBackwardRefsClear(local_1968);
  VP8LBackwardRefsClear(local_18b8);
  iVar7 = *(int *)(local_18f0 + 0x5c);
  if (iVar7 < 100) {
    if (enc->use_palette != 0) {
      enc->argb_content = kEncoderNone;
      goto LAB_00132744;
    }
    if (enc->use_predict != 0) {
      enc->argb_content = kEncoderNone;
LAB_001329d5:
      pWVar24 = enc->pic;
      iVar7 = pWVar24->width;
      iVar25 = pWVar24->height;
      iVar9 = AllocateTransformBuffer(enc,iVar7,iVar25);
      iVar10 = (int)lVar14;
      if (iVar9 == 0) goto LAB_00133936;
      if (enc->argb_content != kEncoderARGB) {
        puVar30 = enc->argb;
        puVar26 = pWVar24->argb;
        if (iVar25 < 1) {
          iVar25 = 0;
        }
        while( true ) {
          iVar10 = (int)lVar14;
          bVar33 = iVar25 == 0;
          iVar25 = iVar25 + -1;
          if (bVar33) break;
          memcpy(puVar30,puVar26,(long)iVar7 * 4);
          puVar26 = puVar26 + pWVar24->argb_stride;
          puVar30 = puVar30 + iVar7;
        }
        local_1970->argb_content = kEncoderARGB;
        enc = local_1970;
      }
      goto LAB_00132dde;
    }
    iVar10 = AllocateTransformBuffer(enc,local_192c,(int)local_19a0);
    if (iVar10 == 0) goto LAB_00133936;
    VVar18 = kEncoderNearLossless;
    if (enc->argb_content == kEncoderNearLossless) goto LAB_00132735;
    iVar10 = VP8ApplyNearLossless(local_19c8,*(int *)(local_18f0 + 0x5c),enc->argb);
    VVar18 = kEncoderNearLossless;
    pWVar24 = local_19c8;
    if (iVar10 == 0) goto LAB_00133931;
  }
LAB_00132735:
  iVar10 = (int)lVar14;
  enc->argb_content = VVar18;
  if (enc->use_palette == 0) {
    if (99 < iVar7) goto LAB_001329d5;
  }
  else {
LAB_00132744:
    iVar7 = PaletteSort(*(PaletteSorting *)(local_1948 + 4),enc->pic,local_18c0,enc->palette_size,
                        local_1998);
    pVVar19 = local_19e0;
    if (iVar7 == 0) {
      pWVar24 = enc->pic;
      goto LAB_00133931;
    }
    uVar31 = enc->palette_size;
    uVar5 = uVar31 - 1;
    if (enc->palette[(long)(int)uVar31 + -1] != 0) {
      uVar5 = uVar31;
    }
    if ((long)(int)uVar31 < 0x12) {
      uVar5 = uVar31;
    }
    local_19d4 = iVar4;
    VP8LPutBits(local_19e0,1,1);
    VP8LPutBits(pVVar19,3,2);
    VP8LPutBits(pVVar19,uVar5 - 1,8);
    pHVar13 = local_1980;
    for (uVar32 = (ulong)(uVar5 - 1); enc = local_1970, 0 < (int)uVar32; uVar32 = uVar32 - 1) {
      uVar8 = VP8LSubPixels(local_1998[uVar32],local_1998[uVar32 - 1]);
      *(uint32_t *)(buffer + uVar32 * 2) = uVar8;
    }
    uVar22 = (uint)(char)((char)(0x61 / (long)(int)uVar22) / '\x04');
    buffer._0_4_ = local_1970->palette[0];
    uVar32 = (ulong)uVar5;
    in_R9 = (HuffmanTreeCode *)0x1;
    iVar4 = EncodeImageNoHuffman
                      (pVVar19,(uint32_t *)buffer,local_1960,local_1968,uVar5,1,0x14,(int)pHVar13,
                       local_1970->pic,uVar22,&percent);
    if (iVar4 == 0) goto LAB_00133936;
    pWVar24 = enc->pic;
    uVar31 = pWVar24->width;
    nmemb = (uint64_t)(int)uVar31;
    local_19c0 = (uint32_t *)(long)enc->palette_size;
    local_19f4 = (uint)((long)local_19c0 < 0x11);
    if ((long)local_19c0 < 5) {
      local_19f4 = (long)local_19c0 < 3 | 2;
    }
    local_19f0 = CONCAT44(local_19f0._4_4_,pWVar24->height);
    iVar4 = AllocateTransformBuffer
                      (enc,(uVar31 + (1 << (sbyte)local_19f4)) - 1 >> (sbyte)local_19f4,
                       pWVar24->height);
    if (iVar4 == 0) goto LAB_00133936;
    puVar26 = pWVar24->argb;
    local_19b8 = (uint32_t *)(ulong)(uint)pWVar24->argb_stride;
    local_19e8 = enc->argb;
    local_1988 = (ulong)(uint)enc->current_width;
    ptr = (uint8_t *)WebPSafeMalloc(nmemb,1);
    iVar10 = (int)uVar32;
    if (ptr == (uint8_t *)0x0) {
      iVar4 = WebPEncodingSetError(pWVar24,VP8_ENC_ERROR_OUT_OF_MEMORY);
      if (iVar4 == 0) goto LAB_00133936;
    }
    else {
      local_19b0 = nmemb;
      local_1950 = (ulong)uVar22;
      if (3 < (int)local_19c0) {
        lVar14 = 0;
LAB_00132a40:
        if (lVar14 == 3) {
LAB_00132b6c:
          puVar30 = local_1998;
          PrepareMapToPalette(local_1998,(uint32_t)local_19c0,(uint32_t *)&hash_chain_histogram,
                              idx_map);
          uVar8 = *puVar30;
          iVar4 = 0;
          local_19d0 = (HuffmanTree *)0x0;
          if (0 < (int)local_19b0) {
            local_19d0 = (HuffmanTree *)(local_19b0 & 0xffffffff);
          }
          iVar7 = (int)local_19f0;
          if ((int)local_19f0 < 1) {
            iVar7 = 0;
          }
          local_19f0 = CONCAT44(local_19f0._4_4_,iVar7);
          local_19b8 = (uint32_t *)((long)local_19b8 << 2);
          uVar23 = 0;
          while( true ) {
            iVar10 = (int)uVar32;
            if (iVar4 == (int)local_19f0) break;
            local_1938 = (VP8LBackwardRefs *)CONCAT44(local_1938._4_4_,iVar4);
            for (pHVar12 = (HuffmanTree *)0x0; puVar30 = local_19e8, local_19d0 != pHVar12;
                pHVar12 = (HuffmanTree *)((long)&pHVar12->total_count + 1)) {
              color = puVar26[(long)pHVar12];
              if (color != uVar8) {
                iVar4 = SearchColorNoIdx((uint32_t *)&hash_chain_histogram,color,(int)local_19c0);
                uVar23 = idx_map[iVar4];
                uVar8 = color;
              }
              ptr[(long)pHVar12] = (uint8_t)uVar23;
            }
            (*VP8LBundleColorMap)(ptr,(int)local_19b0,local_19f4,local_19e8);
            local_19e8 = puVar30 + local_1988;
            iVar4 = (int)local_1938 + 1;
            puVar26 = (uint32_t *)((long)puVar26 + (long)local_19b8);
          }
        }
        else {
          memset(buffer,0xff,0x1000);
          pcVar2 = (code *)(&PTR_ApplyPaletteHash0_001eec50)[lVar14];
          puVar30 = (uint32_t *)0x0;
LAB_00132a6f:
          if (local_19c0 != puVar30) goto code_r0x00132a76;
          iVar7 = (int)lVar14;
          iVar4 = (int)local_19b0;
          if (iVar7 == 2) {
            uVar22 = *local_1998;
            iVar7 = 0;
            uVar29 = 0;
            if (0 < iVar4) {
              uVar29 = local_19b0 & 0xffffffff;
            }
            if ((int)local_19f0 < 1) {
              local_19f0._0_4_ = iVar7;
            }
            local_19b8 = (uint32_t *)((long)local_19b8 << 2);
            uVar28 = '\0';
            while( true ) {
              puVar30 = local_19e8;
              iVar10 = (int)uVar32;
              if (iVar7 == (int)local_19f0) break;
              local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,iVar7);
              for (uVar11 = 0; uVar29 != uVar11; uVar11 = uVar11 + 1) {
                uVar31 = puVar26[uVar11];
                if (uVar31 != uVar22) {
                  uVar28 = (uint8_t)buffer[(uVar31 & 0xffffff) * 0x7fffffff >> 0x15];
                  uVar22 = uVar31;
                }
                ptr[uVar11] = uVar28;
              }
              (*VP8LBundleColorMap)(ptr,(int)local_19b0,local_19f4,local_19e8);
              local_19e8 = puVar30 + local_1988;
              iVar7 = (int)local_19d0 + 1;
              puVar26 = (uint32_t *)((long)puVar26 + (long)local_19b8);
            }
          }
          else {
            if (iVar7 == 1) {
              uVar22 = *local_1998;
              iVar7 = 0;
              uVar29 = 0;
              if (0 < iVar4) {
                uVar29 = local_19b0 & 0xffffffff;
              }
              if ((int)local_19f0 < 1) {
                local_19f0._0_4_ = iVar7;
              }
              local_19b8 = (uint32_t *)((long)local_19b8 << 2);
              uVar28 = '\0';
              while( true ) {
                puVar30 = local_19e8;
                iVar10 = (int)uVar32;
                if (iVar7 == (int)local_19f0) break;
                local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,iVar7);
                for (uVar11 = 0; uVar29 != uVar11; uVar11 = uVar11 + 1) {
                  uVar31 = puVar26[uVar11];
                  if (uVar31 != uVar22) {
                    uVar28 = (uint8_t)buffer[(uVar31 & 0xffffff) * -0x455ab19 >> 0x15];
                    uVar22 = uVar31;
                  }
                  ptr[uVar11] = uVar28;
                }
                (*VP8LBundleColorMap)(ptr,(int)local_19b0,local_19f4,local_19e8);
                local_19e8 = puVar30 + local_1988;
                iVar7 = (int)local_19d0 + 1;
                puVar26 = (uint32_t *)((long)puVar26 + (long)local_19b8);
              }
              goto LAB_00132d95;
            }
            if (iVar7 != 0) goto LAB_00132b6c;
            uVar22 = *local_1998;
            iVar7 = 0;
            uVar29 = 0;
            if (0 < iVar4) {
              uVar29 = local_19b0 & 0xffffffff;
            }
            if ((int)local_19f0 < 1) {
              local_19f0._0_4_ = iVar7;
            }
            local_19b8 = (uint32_t *)((long)local_19b8 << 2);
            uVar28 = '\0';
            while( true ) {
              puVar30 = local_19e8;
              iVar10 = (int)uVar32;
              if (iVar7 == (int)local_19f0) break;
              local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,iVar7);
              for (uVar11 = 0; uVar29 != uVar11; uVar11 = uVar11 + 1) {
                uVar31 = puVar26[uVar11];
                if (uVar31 != uVar22) {
                  uVar28 = (uint8_t)buffer[uVar31 >> 8 & 0xff];
                  uVar22 = uVar31;
                }
                ptr[uVar11] = uVar28;
              }
              (*VP8LBundleColorMap)(ptr,(int)local_19b0,local_19f4,local_19e8);
              local_19e8 = puVar30 + local_1988;
              iVar7 = (int)local_19d0 + 1;
              puVar26 = (uint32_t *)((long)puVar26 + (long)local_19b8);
            }
          }
        }
        goto LAB_00132d95;
      }
      uVar22 = *local_1998;
      bVar21 = 0;
      uVar29 = 0;
      if (0 < (int)uVar31) {
        uVar29 = (ulong)uVar31;
      }
      iVar4 = (int)local_19f0;
      if ((int)local_19f0 < 1) {
        iVar4 = 0;
      }
      local_19f0 = CONCAT44(local_19f0._4_4_,iVar4);
      local_19b8 = (uint32_t *)((long)local_19b8 << 2);
      iVar4 = 0;
      while( true ) {
        puVar30 = local_19e8;
        iVar10 = (int)uVar32;
        if (iVar4 == (int)local_19f0) break;
        local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,iVar4);
        for (uVar11 = 0; uVar29 != uVar11; uVar11 = uVar11 + 1) {
          uVar31 = puVar26[uVar11];
          if (uVar31 != uVar22) {
            uVar22 = uVar31;
            if (*local_1998 == uVar31) {
              bVar21 = 0;
            }
            else {
              bVar21 = 1;
              if (local_1970->palette[1] != uVar31) {
                bVar21 = local_1970->palette[2] == uVar31 ^ 3;
              }
            }
          }
          ptr[uVar11] = bVar21;
        }
        (*VP8LBundleColorMap)(ptr,(int)local_19b0,local_19f4,local_19e8);
        local_19e8 = puVar30 + local_1988;
        iVar4 = (int)local_19d0 + 1;
        puVar26 = (uint32_t *)((long)puVar26 + (long)local_19b8);
      }
LAB_00132d95:
      WebPSafeFree(ptr);
      uVar22 = (uint)local_1950;
      enc = local_1970;
    }
    iVar4 = local_19d4 - uVar22;
    enc->argb_content = kEncoderPalette;
    uVar22 = enc->palette_size;
    if ((int)uVar22 < 0x400) {
      uVar31 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      enc->cache_bits = (uVar31 ^ 0xffffffe0) + 0x21;
    }
  }
LAB_00132dde:
  pVVar19 = local_19e0;
  if (enc->use_subtract_green != 0) {
    iVar7 = enc->current_width * (int)local_19a0;
    VP8LPutBits(local_19e0,1,1);
    VP8LPutBits(pVVar19,2,2);
    (*VP8LSubtractGreenFromBlueAndRed)(enc->argb,iVar7);
  }
  iVar7 = (int)in_R9;
  if (enc->use_predict != 0) {
    local_19e8 = (uint32_t *)CONCAT44(local_19e8._4_4_,iVar4 / 3);
    iVar25 = 100;
    if (enc->use_palette == 0) {
      iVar25 = enc->config->near_lossless;
    }
    local_19c0 = (uint32_t *)CONCAT44(local_19c0._4_4_,iVar25);
    iVar9 = enc->current_width;
    local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,enc->use_subtract_green);
    height = (int)local_19a0;
    max_bits = ClampBits(iVar9,height,enc->predictor_transform_bits,0x4000,iVar10,iVar7);
    pWVar3 = enc->config;
    iVar1 = pWVar3->method;
    iVar25 = iVar1 * 2 + -8;
    if (iVar1 < 5) {
      iVar25 = 0;
    }
    iVar7 = ClampBits(iVar9,height,max_bits - iVar25,0x4000,iVar10,iVar7);
    iVar10 = (int)local_1980;
    local_19d4 = iVar4;
    iVar7 = VP8LResidualImage(iVar9,height,iVar7,max_bits,iVar10,enc->argb,enc->argb_scratch,
                              enc->transform_data,(int)local_19c0,pWVar3->exact,(int)local_19d0,
                              enc->pic,iVar4 / 6,&percent,(int *)buffer);
    pVVar19 = local_19e0;
    if (iVar7 == 0) goto LAB_00133936;
    VP8LPutBits(local_19e0,1,1);
    VP8LPutBits(pVVar19,0,2);
    VP8LPutBits(pVVar19,buffer._0_4_ - 2,3);
    bVar21 = (byte)buffer._0_8_;
    iVar25 = 1 << (bVar21 & 0x1f);
    uVar22 = (uint)(iVar25 + local_198c) >> (bVar21 & 0x1f);
    in_R9 = (HuffmanTreeCode *)(ulong)uVar22;
    enc->predictor_transform_bits = buffer._0_4_;
    iVar7 = (int)local_19e8;
    iVar4 = EncodeImageNoHuffman
                      (pVVar19,enc->transform_data,local_1960,local_1968,
                       (iVar9 + iVar25) - 1U >> (bVar21 & 0x1f),uVar22,(int)local_1978,iVar10,
                       enc->pic,(int)local_19e8 - iVar4 / 6,&percent);
    if (iVar4 == 0) goto LAB_00133936;
    iVar4 = local_19d4 - iVar7;
  }
  local_19d4 = iVar4;
  if (enc->use_cross_color != 0) {
    local_19d0 = (HuffmanTree *)CONCAT44(local_19d0._4_4_,iVar4 / 2);
    iVar7 = enc->current_width;
    iVar10 = VP8LColorSpaceTransform
                       (iVar7,(int)local_19a0,enc->cross_color_transform_bits,(int)local_1978,
                        enc->argb,enc->transform_data,enc->pic,iVar4 / 4,&percent,(int *)buffer);
    pVVar19 = local_19e0;
    if (iVar10 == 0) goto LAB_00133936;
    VP8LPutBits(local_19e0,1,1);
    VP8LPutBits(pVVar19,1,2);
    VP8LPutBits(pVVar19,buffer._0_4_ - 2,3);
    bVar21 = (byte)buffer._0_8_;
    iVar25 = 1 << (bVar21 & 0x1f);
    uVar22 = (uint)(iVar25 + local_198c) >> (bVar21 & 0x1f);
    in_R9 = (HuffmanTreeCode *)(ulong)uVar22;
    enc->cross_color_transform_bits = buffer._0_4_;
    iVar10 = (int)local_19d0;
    iVar4 = EncodeImageNoHuffman
                      (pVVar19,enc->transform_data,local_1960,local_1968,
                       (iVar7 + iVar25) - 1U >> (bVar21 & 0x1f),uVar22,(int)local_1978,
                       (int)local_1980,enc->pic,(int)local_19d0 - iVar4 / 4,&percent);
    if (iVar4 == 0) goto LAB_00133936;
    local_19d4 = local_19d4 - iVar10;
  }
  pVVar19 = local_19e0;
  VP8LPutBits(local_19e0,0,1);
  uVar22 = enc->histo_bits;
  bVar21 = (byte)uVar22;
  iVar4 = 1 << (bVar21 & 0x1f);
  local_19e8 = (uint32_t *)(ulong)(uint)enc->current_width;
  local_19b8 = enc->argb;
  uVar31 = ((uint)(iVar4 + local_198c) >> (bVar21 & 0x1f)) *
           ((enc->current_width + iVar4) - 1U >> (bVar21 & 0x1f));
  uVar32 = (ulong)uVar31;
  local_19b0 = CONCAT44(local_19b0._4_4_,percent);
  pHVar12 = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
  local_19c0 = (uint32_t *)WebPSafeMalloc(uVar32,4);
  buffer._0_8_ = pVVar19->bits;
  buffer._8_8_ = *(undefined8 *)&pVVar19->used;
  buffer._16_8_ = pVVar19->buf;
  buffer._24_8_ = pVVar19->cur;
  buffer._32_8_ = pVVar19->end;
  buffer._40_8_ = *(undefined8 *)&pVVar19->error;
  hash_chain_histogram.offset_length = (uint32_t *)0x0;
  hash_chain_histogram.size = 0;
  hash_chain_histogram._12_4_ = 0;
  iVar4 = VP8LBitWriterInit((VP8LBitWriter *)idx_map,0);
  local_19d0 = pHVar12;
  if ((((iVar4 == 0) || (pHVar12 == (HuffmanTree *)0x0)) || (local_19c0 == (uint32_t *)0x0)) ||
     (iVar4 = VP8LHashChainInit(&hash_chain_histogram,uVar31), iVar4 == 0)) {
LAB_00133728:
    WebPEncodingSetError(local_19c8,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    iVar7 = local_19d4 / 5;
    in_R9 = local_1980;
    iVar4 = VP8LHashChainFill(local_1960,(int)local_1978,local_19b8,(int)local_19e8,(int)local_19a0,
                              (int)local_1980,local_19c8,iVar7,&percent);
    if (iVar4 != 0) {
      local_18e8 = (ulong)(uint)local_1970->cache_bits;
      if (local_1970->cache_bits == 0) {
        local_18e8 = 10;
      }
      if (((1 < *(int *)(local_1948 + 0x18)) || (*(int *)(local_1948 + 0xc) != 0)) &&
         (iVar4 = VP8LBitWriterClone(pVVar19,(VP8LBitWriter *)idx_map), iVar4 == 0))
      goto LAB_00133728;
      local_18e0 = (ulong)((int)local_19e8 - 1);
      local_1930 = local_19d4 - iVar7;
      local_1910 = 0xffffffffffffffff;
      local_1950 = CONCAT44(local_1950._4_4_,uVar22);
      lVar14 = 0;
      local_1918 = uVar32;
      while (lVar14 < *(int *)(local_1948 + 0x18)) {
        uVar29 = (long)local_1930 / (long)*(int *)(local_1948 + 0x18);
        iVar4 = (int)uVar29;
        uVar31 = *(uint *)(local_1948 + 8 + lVar14 * 8);
        in_R9 = (HuffmanTreeCode *)(ulong)uVar31;
        iVar10 = (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) / 4);
        local_18d0 = lVar14;
        iVar7 = VP8LGetBackwardReferences
                          ((int)local_19e8,(int)local_19a0,local_19b8,(int)local_1978,
                           (int)local_1980,uVar31,(int)local_18e8,
                           *(int *)(local_1948 + 0xc + lVar14 * 8),local_1960,local_1968,
                           &cache_bits_best,local_19c8,iVar10,&percent);
        if (iVar7 == 0) goto LAB_00133734;
        local_19f4 = iVar4 - iVar10;
        uVar29 = 0;
        while (uVar11 = local_1978,
              uVar29 < 2 - (ulong)(*(int *)(local_1948 + 0xc + local_18d0 * 8) == 0)) {
          uVar27 = 0;
          if (uVar29 == 0) {
            uVar27 = (ulong)(uint)cache_bits_best;
          }
          local_19a4 = uVar22;
          if (uVar29 == 1 && cache_bits_best == 0) break;
          local_1988 = uVar29;
          VP8LBitWriterReset((VP8LBitWriter *)buffer,pVVar19);
          image_histo = VP8LAllocateHistogramSet((int)uVar32,(int)uVar27);
          local_19f0 = uVar27;
          tmp_histo = VP8LAllocateHistogram((int)uVar27);
          uVar22 = local_19f4;
          if ((image_histo == (VP8LHistogramSet *)0x0) || (tmp_histo == (VP8LHistogram *)0x0)) {
            pHVar13 = (HuffmanTreeCode *)0x0;
            goto LAB_001338e3;
          }
          iVar7 = (int)local_19f4 / 3;
          refs = local_1968 + local_1988;
          in_R9 = (HuffmanTreeCode *)(ulong)local_19a4;
          iVar4 = VP8LGetHistoImageSymbols
                            ((int)local_19e8,(int)local_19a0,refs,(int)uVar11,(int)local_1980,
                             local_19a4,(int)local_19f0,image_histo,tmp_histo,local_19c0,local_19c8,
                             iVar7,&percent);
          if (iVar4 == 0) {
            tokens = (HuffmanTreeToken *)0x0;
            pHVar13 = (HuffmanTreeCode *)0x0;
            goto LAB_0013373f;
          }
          pHVar13 = (HuffmanTreeCode *)WebPSafeCalloc((ulong)(uint)(image_histo->size * 5),0x18);
          if (pHVar13 == (HuffmanTreeCode *)0x0) {
            pHVar13 = (HuffmanTreeCode *)0x0;
LAB_001338e3:
            WebPEncodingSetError(local_19c8,VP8_ENC_ERROR_OUT_OF_MEMORY);
            tokens = (HuffmanTreeToken *)0x0;
            goto LAB_0013373f;
          }
          iVar4 = GetHuffBitLengthsAndCodes(image_histo,pHVar13);
          if (iVar4 == 0) goto LAB_001338e3;
          local_1938 = refs;
          VP8LFreeHistogramSet(image_histo);
          VP8LFreeHistogram(tmp_histo);
          pVVar19 = local_19e0;
          uVar8 = (uint32_t)local_19f0;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
            iVar4 = 1;
          }
          else {
            VP8LPutBits(local_19e0,1,1);
            iVar4 = 4;
          }
          VP8LPutBits(pVVar19,uVar8,iVar4);
          uVar32 = local_1918;
          local_19f4 = uVar22 - iVar7;
          uVar22 = 0;
          for (uVar29 = 0; local_1918 != uVar29; uVar29 = uVar29 + 1) {
            uVar31 = local_19c0[uVar29];
            if (uVar22 <= uVar31) {
              uVar22 = uVar31 + 1;
            }
            local_19c0[uVar29] = uVar31 << 8;
          }
          VP8LPutBits(pVVar19,(uint)(1 < uVar22),1);
          if (1 < uVar22) {
            VP8LOptimizeSampling
                      (local_19c0,(int)local_19e8,(int)local_19a0,(uint)local_1950,9,
                       (int *)&local_19a4);
            VP8LPutBits(pVVar19,local_19a4 - 2,3);
            uVar31 = local_19f4;
            iVar7 = (int)local_19f4 / 2;
            iVar4 = 1 << ((byte)local_19a4 & 0x1f);
            uVar5 = (uint)(iVar4 + local_198c) >> ((byte)local_19a4 & 0x1f);
            in_R9 = (HuffmanTreeCode *)(ulong)uVar5;
            iVar4 = EncodeImageNoHuffman
                              (pVVar19,local_19c0,&hash_chain_histogram,local_18d8,
                               (uint)(iVar4 + (int)local_18e0) >> ((byte)local_19a4 & 0x1f),uVar5,
                               (int)local_1978,(int)local_1980,local_19c8,iVar7,&percent);
            if (iVar4 == 0) {
              tokens = (HuffmanTreeToken *)0x0;
              goto LAB_0013373a;
            }
            local_19f4 = uVar31 - iVar7;
          }
          lVar20 = (ulong)(uVar22 * 5) * 0x18;
          uVar22 = 0;
          for (lVar14 = 0; lVar20 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
            uVar31 = *(uint *)((long)&pHVar13->num_symbols + lVar14);
            if ((int)uVar22 <= (int)uVar31) {
              uVar22 = uVar31;
            }
          }
          tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar22,2);
          if (tokens == (HuffmanTreeToken *)0x0) {
            tmp_histo = (VP8LHistogram *)0x0;
            image_histo = (VP8LHistogramSet *)0x0;
            goto LAB_001338e3;
          }
          for (lVar14 = 0; pVVar19 = local_19e0, lVar20 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
            huffman_code = (HuffmanTreeCode *)((long)&pHVar13->num_symbols + lVar14);
            StoreHuffmanCode(local_19e0,local_19d0,tokens,huffman_code);
            ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
          }
          sVar15 = VP8LBitWriterNumBytes(local_19e0);
          in_R9 = pHVar13;
          iVar4 = StoreImageToBitMask(pVVar19,(int)local_19e8,local_19a4,local_1938,local_19c0,
                                      pHVar13,local_19c8);
          if (iVar4 == 0) goto LAB_0013373a;
          sVar16 = VP8LBitWriterNumBytes(pVVar19);
          if (sVar16 < local_1910) {
            local_1954 = (int)sVar15 - (int)local_1900;
            local_1970->cache_bits = (int)local_19f0;
            sVar17 = VP8LBitWriterNumBytes(pVVar19);
            local_1908 = (ulong)(uint)((int)sVar17 - (int)sVar15);
            VP8LBitWriterSwap(pVVar19,(VP8LBitWriter *)idx_map);
            local_1910 = sVar16;
          }
          WebPSafeFree(tokens);
          WebPSafeFree(pHVar13->codes);
          WebPSafeFree(pHVar13);
          uVar22 = (uint)local_1950;
          uVar29 = local_1988 + 1;
        }
        lVar14 = local_18d0 + 1;
      }
      VP8LBitWriterSwap(pVVar19,(VP8LBitWriter *)idx_map);
      WebPReportProgress(local_19c8,(int)local_19b0 + local_19d4,&percent);
    }
  }
LAB_00133734:
  tokens = (HuffmanTreeToken *)0x0;
  pHVar13 = (HuffmanTreeCode *)0x0;
LAB_0013373a:
  tmp_histo = (VP8LHistogram *)0x0;
  image_histo = (VP8LHistogramSet *)0x0;
LAB_0013373f:
  WebPSafeFree(tokens);
  WebPSafeFree(local_19d0);
  VP8LFreeHistogramSet(image_histo);
  VP8LFreeHistogram(tmp_histo);
  VP8LHashChainClear(&hash_chain_histogram);
  if (pHVar13 != (HuffmanTreeCode *)0x0) {
    WebPSafeFree(pHVar13->codes);
    WebPSafeFree(pHVar13);
  }
  WebPSafeFree(local_19c0);
  VP8LBitWriterWipeOut((VP8LBitWriter *)idx_map);
  enc = local_1970;
  pVVar19 = local_19e0;
  if (local_19c8->error_code != VP8_ENC_OK) goto LAB_00133936;
  sVar15 = VP8LBitWriterNumBytes(local_19e0);
  uVar22 = local_1928;
  if ((sVar15 < local_1940) &&
     (VP8LBitWriterSwap(pVVar19,&bw_best), local_1940 = sVar15, local_18c8 != 0)) {
    uVar31 = (uint)(enc->use_predict != 0);
    *(uint *)(local_18c8 + 0x94) = uVar31;
    if (enc->use_cross_color != 0) {
      uVar31 = uVar31 | 2;
      *(uint *)(local_18c8 + 0x94) = uVar31;
    }
    if (enc->use_subtract_green != 0) {
      uVar31 = uVar31 | 4;
      *(uint *)(local_18c8 + 0x94) = uVar31;
    }
    if (enc->use_palette != 0) {
      *(uint *)(local_18c8 + 0x94) = uVar31 | 8;
    }
    *(undefined8 *)(local_18c8 + 0x98) = *(undefined8 *)&enc->histo_bits;
    *(int *)(local_18c8 + 0xb4) = enc->cross_color_transform_bits;
    *(int *)(local_18c8 + 0xa0) = enc->cache_bits;
    *(int *)(local_18c8 + 0xa4) = enc->palette_size;
    *(int *)(local_18c8 + 0xa8) = (int)sVar15 - (int)local_1900;
    *(int *)(local_18c8 + 0xac) = local_1954;
    *(int *)(local_18c8 + 0xb0) = (int)local_1908;
  }
  if (1 < (int)uVar22) {
    VP8LBitWriterReset(&bw_init,pVVar19);
  }
  uVar32 = local_18a0 + 1;
  goto LAB_001325fb;
code_r0x00132a76:
  uVar22 = (*pcVar2)(local_1998[(long)puVar30]);
  if (buffer[uVar22] == 0xffff) goto code_r0x00132a8f;
  lVar14 = lVar14 + 1;
  goto LAB_00132a40;
code_r0x00132a8f:
  buffer[uVar22] = (uint16_t)puVar30;
  puVar30 = (uint32_t *)((long)puVar30 + 1);
  goto LAB_00132a6f;
LAB_0013396d:
  VP8LBitWriterSwap(&bw_best,pVVar19);
LAB_00133936:
  VP8LBitWriterWipeOut(&bw_best);
  return (int)(*(int *)(*(long *)((long)local_18f8 + 8) + 0x88) == 0);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config;
  const WebPPicture* const picture = params->picture;
  VP8LBitWriter* const bw = params->bw;
  VP8LEncoder* const enc = params->enc;
  const CrunchConfig* const crunch_configs = params->crunch_configs;
  const int num_crunch_configs = params->num_crunch_configs;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats;
#endif
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
  int percent = 2;  // for WebPProgressHook
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx;
    int remaining_percent = 97 / num_crunch_configs, percent_range;
    enc->use_palette =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict = (entropy_idx == kSpatial) ||
                       (entropy_idx == kSpatialSubGreen) ||
                       (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette) {
      enc->use_cross_color = 0;
    } else {
      enc->use_cross_color = red_and_blue_always_zero ? 0 : enc->use_predict;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits = 0;
    VP8LBackwardRefsClear(&enc->refs[0]);
    VP8LBackwardRefsClear(&enc->refs[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette &&
                        !enc->use_predict;
    if (use_near_lossless) {
      if (!AllocateTransformBuffer(enc, width, height)) goto Error;
      if ((enc->argb_content != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb)) {
        WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      enc->argb_content = kEncoderNearLossless;
    } else {
      enc->argb_content = kEncoderNone;
    }
#else
    enc->argb_content = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette) {
      if (!PaletteSort(crunch_configs[idx].palette_sorting_type, enc->pic,
                       enc->palette_sorted, enc->palette_size,
                       enc->palette)) {
        WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      percent_range = remaining_percent / 4;
      if (!EncodePalette(bw, low_effort, enc, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
      if (!MapImageFromPalette(enc)) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (enc->palette_size < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits = BitsLog2Floor(enc->palette_size) + 1;
      }
    }
    // In case image is not packed.
    if (enc->argb_content != kEncoderNearLossless &&
        enc->argb_content != kEncoderPalette) {
      if (!MakeInputImageCopy(enc)) goto Error;
    }

    // -------------------------------------------------------------------------
    // Apply transforms and write transform data.

    if (enc->use_subtract_green) {
      ApplySubtractGreen(enc, enc->current_width, height, bw);
    }

    if (enc->use_predict) {
      percent_range = remaining_percent / 3;
      if (!ApplyPredictFilter(enc, enc->current_width, height, quality,
                              low_effort, enc->use_subtract_green, bw,
                              percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    if (enc->use_cross_color) {
      percent_range = remaining_percent / 2;
      if (!ApplyCrossColorFilter(enc, enc->current_width, height, quality,
                                 low_effort, bw, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    if (!EncodeImageInternal(
            bw, enc->argb, &enc->hash_chain, enc->refs, enc->current_width,
            height, quality, low_effort, &crunch_configs[idx],
            &enc->cache_bits, enc->histo_bits, byte_position, &hdr_size,
            &data_size, picture, remaining_percent, &percent)) {
      goto Error;
    }

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict) stats->lossless_features |= 1;
        if (enc->use_cross_color) stats->lossless_features |= 2;
        if (enc->use_subtract_green) stats->lossless_features |= 4;
        if (enc->use_palette) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits;
        stats->transform_bits = enc->predictor_transform_bits;
        stats->cross_color_transform_bits = enc->cross_color_transform_bits;
        stats->cache_bits = enc->cache_bits;
        stats->palette_size = enc->palette_size;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

 Error:
  VP8LBitWriterWipeOut(&bw_best);
  // The hook should return false in case of error.
  return (params->picture->error_code == VP8_ENC_OK);
}